

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O2

void __thiscall
dlib::button::set_click_handler<dlib::message_box_helper::box_win>
          (button *this,box_win *object,mfp_pointer_type event_handler_)

{
  pointer *__ptr;
  _Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false> local_88;
  auto_mutex M;
  member_function_pointer<void,_void,_void,_void> local_68;
  
  M.r = (this->super_button_action).super_mouse_over_event.super_drawable.m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  make_mfp<dlib::message_box_helper::box_win>(&local_68,object,event_handler_);
  any_function<void(),void,0ul>::any_function<dlib::member_function_pointer<void,void,void,void>>
            ((any_function<void(),void,0ul> *)&local_88,&local_68);
  any_function<void_(),_void,_0UL>::operator=
            (&this->event_handler,(any_function<void_(),_void,_0UL> *)&local_88);
  if (local_88._M_head_impl != (Tbase<void_()> *)0x0) {
    (*(local_88._M_head_impl)->_vptr_Tbase[1])();
  }
  local_88._M_head_impl = (Tbase<void_()> *)0x0;
  (*(code *)**local_68.super_mfp_kernel_1_base_class<0UL>.mp_memory.data)();
  any_function<void_(dlib::button_&),_void,_1UL>::clear(&this->event_handler_self);
  auto_mutex::~auto_mutex(&M);
  return;
}

Assistant:

void set_click_handler (
            T& object,
            void (T::*event_handler_)()
        )
        {
            auto_mutex M(m);
            event_handler = make_mfp(object,event_handler_);
            event_handler_self.clear();
        }